

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::splitByGeometry(BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  Vec3fx *pVVar1;
  BBox<embree::Vec3fx> *pBVar2;
  PrimRefMB *pPVar3;
  BBox1f BVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  float fVar9;
  float fVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  PrimRefMB *pPVar13;
  PrimRefVector pmVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar25;
  PrimRefMB *pPVar26;
  unsigned_long uVar27;
  ulong unaff_RBP;
  undefined7 uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  PrimRefMB *pPVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 local_118 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  
  uVar11 = (set->super_PrimInfoMB).object_range._begin;
  uVar12 = (set->super_PrimInfoMB).object_range._end;
  pPVar13 = set->prims->items;
  pPVar26 = pPVar13 + uVar11;
  fVar9 = pPVar13[uVar11].lbounds.bounds0.lower.field_0.m128[3];
  pPVar32 = pPVar13 + uVar12;
  auVar46 = ZEXT1664((undefined1  [16])0x0);
  auVar49 = ZEXT464(0x3f800000);
  auVar34 = ZEXT816(0x3f80000000000000);
  auVar37._8_4_ = 0x7f800000;
  auVar37._0_8_ = 0x7f8000007f800000;
  auVar37._12_4_ = 0x7f800000;
  auVar36._8_4_ = 0xff800000;
  auVar36._0_8_ = 0xff800000ff800000;
  auVar36._12_4_ = 0xff800000;
  uVar29 = 0;
  uVar31 = 0;
  local_e8 = auVar49._0_16_;
  local_d8 = ZEXT816(0) << 0x20;
  local_118 = auVar34;
  auVar15 = auVar36;
  auVar16 = auVar37;
  auVar35 = auVar36;
  auVar17 = auVar37;
  local_c8 = auVar37;
  local_b8 = auVar36;
  local_a8 = auVar37;
  local_98 = auVar36;
  local_88 = auVar37;
  local_78 = auVar36;
  while( true ) {
    pPVar3 = pPVar32 + -1;
    while( true ) {
      auVar45 = auVar49._0_16_;
      auVar41 = auVar46._0_16_;
      uVar28 = (undefined7)(unaff_RBP >> 8);
      if ((pPVar3 < pPVar26) || ((pPVar26->lbounds).bounds0.lower.field_0.m128[3] != fVar9)) break;
      aVar5 = (pPVar26->lbounds).bounds0.lower.field_0.field_1;
      aVar6 = (pPVar26->lbounds).bounds0.upper.field_0.field_1;
      aVar7 = (pPVar26->lbounds).bounds1.lower.field_0.field_1;
      aVar8 = (pPVar26->lbounds).bounds1.upper.field_0.field_1;
      auVar47._8_8_ = 0;
      auVar47._0_4_ = (pPVar26->time_range).lower;
      auVar47._4_4_ = (pPVar26->time_range).upper;
      auVar48 = vcmpps_avx(auVar45,auVar47,1);
      auVar42 = vinsertps_avx(auVar45,auVar47,0x50);
      auVar45 = vblendps_avx(auVar47,auVar45,2);
      auVar45 = vblendvps_avx(auVar45,auVar42,auVar48);
      auVar49 = ZEXT1664(auVar45);
      uVar30 = (ulong)(uint)(pPVar26->lbounds).bounds1.upper.field_0.m128[3];
      auVar45 = vpshufd_avx(ZEXT416((uint)CONCAT71(uVar28,uVar31 < uVar30)),0x50);
      auVar45 = vpslld_avx(auVar45,0x1f);
      auVar34 = vblendvps_avx(auVar34,auVar47,auVar45);
      auVar43._0_4_ = aVar6.x * 0.5 + aVar8.x * 0.5 + aVar5.x * 0.5 + aVar7.x * 0.5;
      auVar43._4_4_ = aVar6.y * 0.5 + aVar8.y * 0.5 + aVar5.y * 0.5 + aVar7.y * 0.5;
      auVar43._8_4_ = aVar6.z * 0.5 + aVar8.z * 0.5 + aVar5.z * 0.5 + aVar7.z * 0.5;
      auVar43._12_4_ =
           aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5 +
           aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
      auVar16 = vminps_avx(auVar16,(undefined1  [16])aVar5);
      auVar15 = vmaxps_avx(auVar15,(undefined1  [16])aVar6);
      local_88 = vminps_avx(local_88,(undefined1  [16])aVar7);
      local_78 = vmaxps_avx(local_78,(undefined1  [16])aVar8);
      unaff_RBP = (ulong)(uint)(pPVar26->lbounds).bounds1.lower.field_0.m128[3];
      auVar45 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar45 = vpinsrq_avx(auVar45,unaff_RBP,1);
      auVar17 = vminps_avx(auVar17,auVar43);
      if (uVar31 <= uVar30) {
        uVar31 = uVar30;
      }
      auVar35 = vmaxps_avx(auVar35,auVar43);
      auVar41 = vpaddq_avx(auVar41,auVar45);
      auVar46 = ZEXT1664(auVar41);
      pPVar26 = pPVar26 + 1;
    }
    if (pPVar3 < pPVar26) break;
    fVar10 = pPVar32[-1].lbounds.bounds0.lower.field_0.m128[3];
    pPVar32 = pPVar3;
    while (fVar10 != fVar9) {
      aVar5 = (pPVar32->lbounds).bounds0.lower.field_0.field_1;
      aVar6 = (pPVar32->lbounds).bounds0.upper.field_0.field_1;
      aVar7 = (pPVar32->lbounds).bounds1.lower.field_0.field_1;
      aVar8 = (pPVar32->lbounds).bounds1.upper.field_0.field_1;
      auVar44._8_8_ = 0;
      auVar44._0_4_ = (pPVar32->time_range).lower;
      auVar44._4_4_ = (pPVar32->time_range).upper;
      auVar42 = vcmpps_avx(local_e8,auVar44,1);
      auVar40 = vinsertps_avx(local_e8,auVar44,0x50);
      auVar48 = vblendps_avx(auVar44,local_e8,2);
      local_e8 = vblendvps_avx(auVar48,auVar40,auVar42);
      uVar30 = (ulong)(uint)(pPVar32->lbounds).bounds1.upper.field_0.m128[3];
      auVar48 = vpshufd_avx(ZEXT416((uint)CONCAT71(uVar28,uVar29 < uVar30)),0x50);
      auVar48 = vpslld_avx(auVar48,0x1f);
      local_118 = vblendvps_avx(local_118,auVar44,auVar48);
      auVar48._0_4_ = aVar5.x * 0.5 + aVar7.x * 0.5 + aVar6.x * 0.5 + aVar8.x * 0.5;
      auVar48._4_4_ = aVar5.y * 0.5 + aVar7.y * 0.5 + aVar6.y * 0.5 + aVar8.y * 0.5;
      auVar48._8_4_ = aVar5.z * 0.5 + aVar7.z * 0.5 + aVar6.z * 0.5 + aVar8.z * 0.5;
      auVar48._12_4_ =
           aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5 +
           aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5;
      local_c8 = vminps_avx(local_c8,(undefined1  [16])aVar5);
      local_b8 = vmaxps_avx(local_b8,(undefined1  [16])aVar6);
      local_a8 = vminps_avx(local_a8,(undefined1  [16])aVar7);
      local_98 = vmaxps_avx(local_98,(undefined1  [16])aVar8);
      auVar37 = vminps_avx(auVar37,auVar48);
      auVar36 = vmaxps_avx(auVar36,auVar48);
      auVar48 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar48 = vpinsrq_avx(auVar48,(ulong)(uint)(pPVar32->lbounds).bounds1.lower.field_0.m128[3],1)
      ;
      local_d8 = vpaddq_avx(local_d8,auVar48);
      if (uVar30 < uVar29) {
        uVar30 = uVar29;
      }
      uVar29 = uVar30;
      if (pPVar32 + -1 < pPVar26) goto LAB_002f1fb3;
      fVar10 = pPVar32[-1].lbounds.bounds0.lower.field_0.m128[3];
      pPVar32 = pPVar32 + -1;
    }
    if (pPVar32 < pPVar26) break;
    aVar22 = (pPVar32->lbounds).bounds0.lower.field_0;
    aVar5 = (pPVar32->lbounds).bounds0.upper.field_0.field_1;
    aVar6 = (pPVar32->lbounds).bounds1.lower.field_0.field_1;
    aVar7 = (pPVar32->lbounds).bounds1.upper.field_0.field_1;
    auVar42._0_4_ =
         (pPVar32->lbounds).bounds0.lower.field_0.m128[0] * 0.5 + aVar6.x * 0.5 +
         aVar5.x * 0.5 + aVar7.x * 0.5;
    auVar42._4_4_ =
         (pPVar32->lbounds).bounds0.lower.field_0.m128[1] * 0.5 + aVar6.y * 0.5 +
         aVar5.y * 0.5 + aVar7.y * 0.5;
    auVar42._8_4_ =
         (pPVar32->lbounds).bounds0.lower.field_0.m128[2] * 0.5 + aVar6.z * 0.5 +
         aVar5.z * 0.5 + aVar7.z * 0.5;
    auVar42._12_4_ =
         (pPVar32->lbounds).bounds0.lower.field_0.m128[3] * 0.5 + aVar6.field_3.w * 0.5 +
         aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
    auVar15 = vmaxps_avx(auVar15,(undefined1  [16])aVar5);
    local_88 = vminps_avx(local_88,(undefined1  [16])aVar6);
    local_78 = vmaxps_avx(local_78,(undefined1  [16])aVar7);
    auVar17 = vminps_avx(auVar17,auVar42);
    auVar35 = vmaxps_avx(auVar35,auVar42);
    auVar38._8_8_ = 0;
    auVar38._0_4_ = (pPVar32->time_range).lower;
    auVar38._4_4_ = (pPVar32->time_range).upper;
    auVar48 = vcmpps_avx(auVar45,auVar38,1);
    auVar42 = vinsertps_avx(auVar45,auVar38,0x50);
    auVar45 = vblendps_avx(auVar38,auVar45,2);
    auVar45 = vblendvps_avx(auVar45,auVar42,auVar48);
    auVar49 = ZEXT1664(auVar45);
    auVar45 = vpinsrq_avx(SUB6416(ZEXT864(1),0),
                          (ulong)(uint)(pPVar32->lbounds).bounds1.lower.field_0.m128[3],1);
    auVar41 = vpaddq_avx(auVar41,auVar45);
    auVar46 = ZEXT1664(auVar41);
    uVar30 = (ulong)(uint)(pPVar32->lbounds).bounds1.upper.field_0.m128[3];
    bVar33 = uVar31 < uVar30;
    if (uVar31 <= uVar30) {
      uVar31 = uVar30;
    }
    auVar41 = vpshufd_avx(ZEXT416((uint)CONCAT71(uVar28,bVar33)),0x50);
    auVar41 = vpslld_avx(auVar41,0x1f);
    auVar34 = vblendvps_avx(auVar34,auVar38,auVar41);
    aVar5 = (pPVar26->lbounds).bounds0.lower.field_0.field_1;
    pVVar1 = &(pPVar26->lbounds).bounds0.upper;
    uVar18 = *(undefined8 *)&pVVar1->field_0;
    uVar19 = *(undefined8 *)((long)&(pPVar26->lbounds).bounds0.upper.field_0 + 8);
    aVar25 = pVVar1->field_0;
    pBVar2 = &(pPVar26->lbounds).bounds1;
    aVar23 = (pBVar2->lower).field_0;
    pVVar1 = &(pPVar26->lbounds).bounds1.upper;
    uVar20 = *(undefined8 *)&pVVar1->field_0;
    uVar21 = *(undefined8 *)((long)&(pPVar26->lbounds).bounds1.upper.field_0 + 8);
    aVar24 = pVVar1->field_0;
    auVar39._8_8_ = 0;
    auVar39._0_4_ = (pPVar26->time_range).lower;
    auVar39._4_4_ = (pPVar26->time_range).upper;
    auVar45 = vcmpps_avx(local_e8,auVar39,1);
    auVar48 = vinsertps_avx(local_e8,auVar39,0x50);
    auVar41 = vblendps_avx(auVar39,local_e8,2);
    local_e8 = vblendvps_avx(auVar41,auVar48,auVar45);
    uVar30 = (ulong)(uint)(pPVar26->lbounds).bounds1.upper.field_0.m128[3];
    unaff_RBP = CONCAT71(uVar28,uVar29 < uVar30);
    auVar41 = vpshufd_avx(ZEXT416((uint)unaff_RBP),0x50);
    auVar41 = vpslld_avx(auVar41,0x1f);
    local_118 = vblendvps_avx(local_118,auVar39,auVar41);
    auVar41._0_4_ =
         aVar5.x * 0.5 + (pBVar2->lower).field_0.m128[0] * 0.5 +
         (float)uVar18 * 0.5 + (float)uVar20 * 0.5;
    auVar41._4_4_ =
         aVar5.y * 0.5 + (pPVar26->lbounds).bounds1.lower.field_0.m128[1] * 0.5 +
         (float)((ulong)uVar18 >> 0x20) * 0.5 + (float)((ulong)uVar20 >> 0x20) * 0.5;
    auVar41._8_4_ =
         aVar5.z * 0.5 + (pPVar26->lbounds).bounds1.lower.field_0.m128[2] * 0.5 +
         (float)uVar19 * 0.5 + (float)uVar21 * 0.5;
    auVar41._12_4_ =
         aVar5.field_3.w * 0.5 + (pPVar26->lbounds).bounds1.lower.field_0.m128[3] * 0.5 +
         (float)((ulong)uVar19 >> 0x20) * 0.5 + (float)((ulong)uVar21 >> 0x20) * 0.5;
    auVar37 = vminps_avx(auVar37,auVar41);
    auVar36 = vmaxps_avx(auVar36,auVar41);
    auVar41 = vpinsrq_avx(SUB6416(ZEXT864(1),0),
                          (ulong)(uint)(pPVar26->lbounds).bounds1.lower.field_0.m128[3],1);
    auVar16 = vminps_avx(auVar16,(undefined1  [16])aVar22);
    local_d8 = vpaddq_avx(local_d8,auVar41);
    (pPVar26->lbounds).bounds0.lower.field_0 = aVar22;
    uVar18 = *(undefined8 *)((long)&(pPVar32->lbounds).bounds0.upper.field_0 + 8);
    *(undefined8 *)&(pPVar26->lbounds).bounds0.upper.field_0 =
         *(undefined8 *)&(pPVar32->lbounds).bounds0.upper.field_0;
    *(undefined8 *)((long)&(pPVar26->lbounds).bounds0.upper.field_0 + 8) = uVar18;
    uVar18 = *(undefined8 *)((long)&(pPVar32->lbounds).bounds1.lower.field_0 + 8);
    *(undefined8 *)&(pPVar26->lbounds).bounds1.lower.field_0 =
         *(undefined8 *)&(pPVar32->lbounds).bounds1.lower.field_0;
    *(undefined8 *)((long)&(pPVar26->lbounds).bounds1.lower.field_0 + 8) = uVar18;
    uVar18 = *(undefined8 *)((long)&(pPVar32->lbounds).bounds1.upper.field_0 + 8);
    *(undefined8 *)&(pPVar26->lbounds).bounds1.upper.field_0 =
         *(undefined8 *)&(pPVar32->lbounds).bounds1.upper.field_0;
    *(undefined8 *)((long)&(pPVar26->lbounds).bounds1.upper.field_0 + 8) = uVar18;
    BVar4 = pPVar26->time_range;
    (pPVar26->time_range).lower = (pPVar32->time_range).lower;
    (pPVar26->time_range).upper = (pPVar32->time_range).upper;
    local_c8 = vminps_avx(local_c8,(undefined1  [16])aVar5);
    (pPVar32->lbounds).bounds0.lower.field_0.field_1 = aVar5;
    local_b8 = vmaxps_avx(local_b8,(undefined1  [16])aVar25);
    (pPVar32->lbounds).bounds0.upper.field_0 = aVar25;
    local_a8 = vminps_avx(local_a8,(undefined1  [16])aVar23);
    (pPVar32->lbounds).bounds1.lower.field_0 = aVar23;
    local_98 = vmaxps_avx(local_98,(undefined1  [16])aVar24);
    if (uVar29 <= uVar30) {
      uVar29 = uVar30;
    }
    (pPVar32->lbounds).bounds1.upper.field_0 = aVar24;
    pPVar32->time_range = BVar4;
    pPVar26 = pPVar26 + 1;
  }
LAB_002f1fb3:
  uVar27 = ((long)pPVar26 - (long)pPVar13) / 0x50;
  auVar40._8_8_ = 0;
  auVar40._0_4_ = (set->super_PrimInfoMB).time_range.lower;
  auVar40._4_4_ = (set->super_PrimInfoMB).time_range.upper;
  auVar42 = vcmpps_avx(auVar45,auVar40,1);
  auVar48 = vblendps_avx(auVar40,auVar45,2);
  auVar45 = vinsertps_avx(auVar45,auVar40,0x50);
  auVar45 = vblendvps_avx(auVar45,auVar48,auVar42);
  pmVar14 = set->prims;
  *(undefined1 (*) [16])
   (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
   field_0.m128 = auVar16;
  *(undefined1 (*) [16])
   (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
   field_0.m128 = auVar15;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower
    .field_0 = local_88._0_8_;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0 + 8) = local_88._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper
    .field_0 = local_78._0_8_;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0 + 8) = local_78._8_8_;
  *(undefined1 (*) [16])
   (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
   m128 = auVar17;
  *(undefined1 (*) [16])
   (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
   m128 = auVar35;
  *(undefined1 (*) [16])&(lset->super_PrimInfoMB).object_range._end = auVar41;
  (lset->super_PrimInfoMB).max_num_time_segments = uVar31;
  auVar34 = vmovlhps_avx(auVar34,auVar45);
  (lset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar34._0_8_;
  (lset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar34._0_8_ >> 0x20);
  (lset->super_PrimInfoMB).time_range.lower = (float)(int)auVar34._8_8_;
  (lset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar34._8_8_ >> 0x20);
  lset->prims = pmVar14;
  (lset->super_PrimInfoMB).object_range._begin = uVar11;
  (lset->super_PrimInfoMB).object_range._end = uVar27;
  auVar35._8_8_ = 0;
  auVar35._0_4_ = (set->super_PrimInfoMB).time_range.lower;
  auVar35._4_4_ = (set->super_PrimInfoMB).time_range.upper;
  auVar15 = vcmpps_avx(local_e8,auVar35,1);
  auVar34 = vblendps_avx(auVar35,local_e8,2);
  auVar35 = vinsertps_avx(local_e8,auVar35,0x50);
  auVar34 = vblendvps_avx(auVar35,auVar34,auVar15);
  pmVar14 = set->prims;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower
    .field_0 = local_c8._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.lower.field_0 + 8) = local_c8._8_8_;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper
    .field_0 = local_b8._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0 + 8) = local_b8._8_8_;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower
    .field_0 = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0 + 8) = local_a8._8_8_;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper
    .field_0 = local_98._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0 + 8) = local_98._8_8_;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
   m128 = auVar37;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
   m128 = auVar36;
  (rset->super_PrimInfoMB).object_range._end = local_d8._0_8_;
  (rset->super_PrimInfoMB).num_time_segments = local_d8._8_8_;
  auVar34 = vmovlhps_avx(local_118,auVar34);
  (rset->super_PrimInfoMB).max_num_time_segments = uVar29;
  (rset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar34._0_8_;
  (rset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar34._0_8_ >> 0x20);
  (rset->super_PrimInfoMB).time_range.lower = (float)(int)auVar34._8_8_;
  (rset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar34._8_8_ >> 0x20);
  rset->prims = pmVar14;
  (rset->super_PrimInfoMB).object_range._begin = uVar27;
  (rset->super_PrimInfoMB).object_range._end = uVar12;
  return;
}

Assistant:

void splitByGeometry(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            assert(set.size() > 1);

            mvector<PrimRefMB>& prims = *set.prims;
            const size_t begin = set.begin();
            const size_t end   = set.end();
            
            PrimInfoMB left(empty);
            PrimInfoMB right(empty);
            unsigned int geomID = prims[begin].geomID();
            size_t center = serial_partitioning(prims.data(),begin,end,left,right,
                                                [&] ( const PrimRefMB& prim ) { return prim.geomID() == geomID; },
                                                [ ] ( PrimInfoMB& dst, const PrimRefMB& prim ) { dst.add_primref(prim); });
            
            new (&lset) SetMB(left, set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(right,set.prims,range<size_t>(center,end  ),set.time_range);
          }